

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Transform * __thiscall sf::Transform::combine(Transform *this,Transform *transform)

{
  float *in_RSI;
  Transform *in_RDI;
  float *b;
  float *a;
  Transform local_60;
  
  Transform(&local_60,
            in_RDI->m_matrix[0xc] * in_RSI[3] +
            in_RDI->m_matrix[0] * *in_RSI + in_RDI->m_matrix[4] * in_RSI[1],
            in_RDI->m_matrix[0xc] * in_RSI[7] +
            in_RDI->m_matrix[0] * in_RSI[4] + in_RDI->m_matrix[4] * in_RSI[5],
            in_RDI->m_matrix[0xc] * in_RSI[0xf] +
            in_RDI->m_matrix[0] * in_RSI[0xc] + in_RDI->m_matrix[4] * in_RSI[0xd],
            in_RDI->m_matrix[0xd] * in_RSI[3] +
            in_RDI->m_matrix[1] * *in_RSI + in_RDI->m_matrix[5] * in_RSI[1],
            in_RDI->m_matrix[0xd] * in_RSI[7] +
            in_RDI->m_matrix[1] * in_RSI[4] + in_RDI->m_matrix[5] * in_RSI[5],
            in_RDI->m_matrix[0xd] * in_RSI[0xf] +
            in_RDI->m_matrix[1] * in_RSI[0xc] + in_RDI->m_matrix[5] * in_RSI[0xd],
            in_RDI->m_matrix[0xf] * in_RSI[3] +
            in_RDI->m_matrix[3] * *in_RSI + in_RDI->m_matrix[7] * in_RSI[1],
            in_RDI->m_matrix[0xf] * in_RSI[7] +
            in_RDI->m_matrix[3] * in_RSI[4] + in_RDI->m_matrix[7] * in_RSI[5],
            in_RDI->m_matrix[0xf] * in_RSI[0xf] +
            in_RDI->m_matrix[3] * in_RSI[0xc] + in_RDI->m_matrix[7] * in_RSI[0xd]);
  memcpy(in_RDI,&local_60,0x40);
  return in_RDI;
}

Assistant:

Transform& Transform::combine(const Transform& transform)
{
    const float* a = m_matrix;
    const float* b = transform.m_matrix;

    *this = Transform(a[0] * b[0]  + a[4] * b[1]  + a[12] * b[3],
                      a[0] * b[4]  + a[4] * b[5]  + a[12] * b[7],
                      a[0] * b[12] + a[4] * b[13] + a[12] * b[15],
                      a[1] * b[0]  + a[5] * b[1]  + a[13] * b[3],
                      a[1] * b[4]  + a[5] * b[5]  + a[13] * b[7],
                      a[1] * b[12] + a[5] * b[13] + a[13] * b[15],
                      a[3] * b[0]  + a[7] * b[1]  + a[15] * b[3],
                      a[3] * b[4]  + a[7] * b[5]  + a[15] * b[7],
                      a[3] * b[12] + a[7] * b[13] + a[15] * b[15]);

    return *this;
}